

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

_Bool msgpack_unpacker_flush_zone(msgpack_unpacker *mpac)

{
  _Bool _Var1;
  void *in_RDX;
  _Bool _Var2;
  
  _Var2 = true;
  if (*(char *)((long)mpac->ctx + 8) == '\x01') {
    _Var1 = msgpack_zone_push_finalizer(mpac->z,(_func_void_void_ptr *)mpac->buffer,in_RDX);
    if (_Var1) {
      *(undefined1 *)((long)mpac->ctx + 8) = 0;
      LOCK();
      *(int *)mpac->buffer = *(int *)mpac->buffer + 1;
      UNLOCK();
    }
    else {
      _Var2 = false;
    }
  }
  return _Var2;
}

Assistant:

bool msgpack_unpacker_flush_zone(msgpack_unpacker* mpac)
{
    if(CTX_REFERENCED(mpac)) {
        if(!msgpack_zone_push_finalizer(mpac->z, decr_count, mpac->buffer)) {
            return false;
        }
        CTX_REFERENCED(mpac) = false;

        incr_count(mpac->buffer);
    }

    return true;
}